

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O3

vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> * __thiscall
DistanceGraph::find_bubbles
          (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
           *__return_storage_ptr__,DistanceGraph *this,uint32_t min_size,uint32_t max_size)

{
  long lVar1;
  pointer pLVar2;
  SequenceDistanceGraph *pSVar3;
  pointer pNVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  vector<Link,_std::allocator<Link>_> fwl;
  vector<Link,_std::allocator<Link>_> parln;
  vector<Link,_std::allocator<Link>_> bwl;
  vector<Link,_std::allocator<Link>_> parlp;
  ulong local_d8;
  vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *local_d0;
  ulong local_c8;
  vector<Link,_std::allocator<Link>_> local_c0;
  ulong local_a8;
  vector<Link,_std::allocator<Link>_> local_a0;
  vector<Link,_std::allocator<Link>_> local_88;
  vector<Link,_std::allocator<Link>_> local_70;
  vector<bool,_std::allocator<bool>_> local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = 0;
  local_d0 = (vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)
             __return_storage_ptr__;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,
             ((long)(this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,(bool *)&local_c0,
             (allocator_type *)&local_88);
  local_d8 = 1;
  pSVar3 = this->sdg;
  pNVar4 = (pSVar3->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(pSVar3->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pNVar4 >> 3) * 0x6db6db6db6db6db7
                 )) {
    uVar5 = (ulong)min_size;
    local_c8 = uVar5;
    do {
      uVar6 = local_d8 + 0x3f;
      if (-1 < (long)local_d8) {
        uVar6 = local_d8;
      }
      if (((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [((long)uVar6 >> 6) +
             ((ulong)((local_d8 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
            (local_d8 & 0x3f) & 1) == 0) &&
         (uVar6 = pNVar4[local_d8].sequence._M_string_length, uVar6 <= max_size && uVar5 <= uVar6))
      {
        get_fw_links(&local_c0,this,local_d8);
        pvVar7 = (void *)CONCAT71(local_c0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                                  super__Vector_impl_data._M_start._1_7_,
                                  local_c0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_1_);
        if ((long)local_c0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pvVar7 == 0x28) {
          get_fw_links(&local_88,this,-local_d8);
          if ((long)local_88.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_88.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x28) {
            lVar1 = (local_88.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                     super__Vector_impl_data._M_start)->dest;
            get_fw_links(&local_a0,this,
                         -*(long *)(CONCAT71(local_c0.
                                             super__Vector_base<Link,_std::allocator<Link>_>._M_impl
                                             .super__Vector_impl_data._M_start._1_7_,
                                             local_c0.
                                             super__Vector_base<Link,_std::allocator<Link>_>._M_impl
                                             .super__Vector_impl_data._M_start._0_1_) + 8));
            if ((long)local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x50) {
              get_fw_links(&local_70,this,-lVar1);
              if ((long)local_70.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_70.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                        super__Vector_impl_data._M_start == 0x50) {
                pLVar2 = local_70.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                         super__Vector_impl_data._M_start + 1;
                if ((local_70.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                     super__Vector_impl_data._M_start)->dest != local_d8) {
                  pLVar2 = local_70.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                           super__Vector_impl_data._M_start;
                }
                local_a8 = pLVar2->dest;
                if (((local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                      super__Vector_impl_data._M_start)->dest + local_a8 == 0) ||
                   (local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                    super__Vector_impl_data._M_start[1].dest + local_a8 == 0)) {
                  uVar5 = -local_a8;
                  if (0 < (long)local_a8) {
                    uVar5 = local_a8;
                  }
                  uVar5 = (this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl
                          .super__Vector_impl_data._M_start[uVar5].sequence._M_string_length;
                  if (uVar5 <= max_size && local_c8 <= uVar5) {
                    uVar5 = local_d8 + 0x3f;
                    if (-1 < (long)local_d8) {
                      uVar5 = local_d8;
                    }
                    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                    [((long)uVar5 >> 6) +
                     ((ulong)((local_d8 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                         local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [((long)uVar5 >> 6) +
                          ((ulong)((local_d8 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                         1L << ((byte)local_d8 & 0x3f);
                    uVar5 = -local_a8;
                    if (0 < (long)local_a8) {
                      uVar5 = local_a8;
                    }
                    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar5 >> 6] =
                         local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar5 >> 6]
                         | 1L << ((byte)uVar5 & 0x3f);
                    std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
                    emplace_back<long&,long&>(local_d0,(long *)&local_d8,(long *)&local_a8);
                    goto LAB_0017b40a;
                  }
                }
              }
              else {
LAB_0017b40a:
                if (local_70.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                    super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_0017b421;
              }
              operator_delete(local_70.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_70.super__Vector_base<Link,_std::allocator<Link>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage -
                              (long)local_70.super__Vector_base<Link,_std::allocator<Link>_>._M_impl
                                    .super__Vector_impl_data._M_start);
            }
LAB_0017b421:
            if (local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage -
                              (long)local_a0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl
                                    .super__Vector_impl_data._M_start);
            }
          }
          if (local_88.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_88.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_88.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          pvVar7 = (void *)CONCAT71(local_c0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl
                                    .super__Vector_impl_data._M_start._1_7_,
                                    local_c0.super__Vector_base<Link,_std::allocator<Link>_>._M_impl
                                    .super__Vector_impl_data._M_start._0_1_);
          uVar5 = local_c8;
        }
        if (pvVar7 != (void *)0x0) {
          operator_delete(pvVar7,(long)local_c0.super__Vector_base<Link,_std::allocator<Link>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar7);
        }
        pSVar3 = this->sdg;
      }
      local_d8 = local_d8 + 1;
      pNVar4 = (pSVar3->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (local_d8 <
             (ulong)(((long)(pSVar3->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pNVar4 >> 3) *
                    0x6db6db6db6db6db7));
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)local_d0;
}

Assistant:

std::vector<std::pair<sgNodeID_t,sgNodeID_t>> DistanceGraph::find_bubbles(uint32_t min_size,uint32_t max_size) const {
    std::vector<std::pair<sgNodeID_t,sgNodeID_t>> r;
    std::vector<bool> used(sdg.nodes.size(),false);
    sgNodeID_t n1,n2;
    size_t s1,s2;
    for (n1=1;n1<sdg.nodes.size();++n1){
        if (used[n1]) continue;
        //get "topologically correct" bubble: prev -> [n1 | n2] -> next
        s1=sdg.nodes[n1].sequence.size();
        if (s1<min_size or s1>max_size) continue;

        auto fwl=get_fw_links(n1);
        if (fwl.size()!=1) continue;
        auto bwl=get_bw_links(n1);
        if (bwl.size()!=1) continue;
        auto next=fwl[0].dest;
        auto prev=bwl[0].dest;
        auto parln=get_bw_links(next);
        if (parln.size()!=2) continue;
        auto parlp=get_fw_links(-prev);
        if (parlp.size()!=2) continue;

        if (parlp[0].dest!=n1) n2=parlp[0].dest;
        else n2=parlp[1].dest;

        if (n2!=-parln[0].dest and n2!=-parln[1].dest) continue;
        s2=sdg.nodes[llabs(n2)].sequence.size();
        if (s2<min_size or s2>max_size) continue;

        used[n1]=true;
        used[llabs(n2)]=true;
        r.emplace_back(n1,n2);

    }
    return r;
}